

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

type llvm::yaml::yamlize<signed_char>(IO *io,char *Val,bool param_3,EmptyContext *Ctx)

{
  StringRef Scalar;
  StringRef SVar1;
  StringRef SVar2;
  bool bVar3;
  uint uVar4;
  QuotingType QVar5;
  string *Str_00;
  void *pvVar6;
  Twine local_100;
  char *local_e8;
  char *local_e0;
  undefined1 local_d8 [8];
  StringRef Result;
  undefined1 local_b8 [8];
  StringRef Str_1;
  undefined1 auStack_98 [8];
  StringRef Str;
  undefined1 local_78 [8];
  raw_string_ostream Buffer;
  string Storage;
  EmptyContext *Ctx_local;
  bool param_2_local;
  char *Val_local;
  IO *io_local;
  
  uVar4 = (*io->_vptr_IO[2])();
  if ((uVar4 & 1) == 0) {
    StringRef::StringRef((StringRef *)local_b8);
    Result.Length = (size_t)local_b8;
    SVar1.Length = (size_t)Str_1.Data;
    SVar1.Data = (char *)local_b8;
    QVar5 = ScalarTraits<signed_char,_void>::mustQuote(SVar1);
    (*io->_vptr_IO[0x1b])(io,local_b8,(ulong)QVar5);
    local_e8 = (char *)local_b8;
    local_e0 = Str_1.Data;
    pvVar6 = IO::getContext(io);
    Scalar.Length = (size_t)local_e0;
    Scalar.Data = local_e8;
    _local_d8 = ScalarTraits<signed_char,_void>::input(Scalar,pvVar6,Val);
    bVar3 = StringRef::empty((StringRef *)local_d8);
    if (!bVar3) {
      Twine::Twine(&local_100,(StringRef *)local_d8);
      (*io->_vptr_IO[0x1f])(io,&local_100);
    }
  }
  else {
    std::__cxx11::string::string((string *)&Buffer.OS);
    raw_string_ostream::raw_string_ostream((raw_string_ostream *)local_78,(string *)&Buffer.OS);
    pvVar6 = IO::getContext(io);
    ScalarTraits<signed_char,_void>::output(Val,pvVar6,(raw_ostream *)local_78);
    Str_00 = raw_string_ostream::str_abi_cxx11_((raw_string_ostream *)local_78);
    StringRef::StringRef((StringRef *)auStack_98,Str_00);
    Str_1.Length = (size_t)auStack_98;
    SVar2.Length = (size_t)Str.Data;
    SVar2.Data = (char *)auStack_98;
    QVar5 = ScalarTraits<signed_char,_void>::mustQuote(SVar2);
    (*io->_vptr_IO[0x1b])(io,auStack_98,(ulong)QVar5);
    raw_string_ostream::~raw_string_ostream((raw_string_ostream *)local_78);
    std::__cxx11::string::~string((string *)&Buffer.OS);
  }
  return;
}

Assistant:

typename std::enable_if<has_ScalarTraits<T>::value, void>::type
yamlize(IO &io, T &Val, bool, EmptyContext &Ctx) {
  if ( io.outputting() ) {
    std::string Storage;
    raw_string_ostream Buffer(Storage);
    ScalarTraits<T>::output(Val, io.getContext(), Buffer);
    StringRef Str = Buffer.str();
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
  }
  else {
    StringRef Str;
    io.scalarString(Str, ScalarTraits<T>::mustQuote(Str));
    StringRef Result = ScalarTraits<T>::input(Str, io.getContext(), Val);
    if ( !Result.empty() ) {
      io.setError(Twine(Result));
    }
  }
}